

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O2

double getAveLen(Mesh *mesh,VectorXd *x)

{
  int iVar1;
  int iVar2;
  long lVar3;
  double *pdVar4;
  int iVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [12];
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
  __begin1;
  double local_50;
  undefined1 local_40 [16];
  
  auVar7 = OpenMesh::PolyConnectivity::edges_begin((PolyConnectivity *)mesh);
  local_40 = auVar7;
  auVar8 = OpenMesh::PolyConnectivity::edges_end((PolyConnectivity *)mesh);
  iVar5 = 0;
  local_50 = 0.0;
  while (auVar8 != auVar7._0_12_) {
    iVar5 = iVar5 + 1;
    lVar3 = *(long *)&(mesh->super_Mesh).
                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                      .super_PolyConnectivity.field_0xe0;
    lVar6 = ((auVar7._8_8_ << 0x21) >> 0x21) * 0x20;
    iVar1 = *(int *)(lVar3 + 4 + lVar6);
    iVar2 = *(int *)(lVar3 + 0x14 + lVar6);
    pdVar4 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_50 = local_50 +
               SQRT((pdVar4[iVar1 * 2 + 1] - pdVar4[iVar2 * 2 + 1]) *
                    (pdVar4[iVar1 * 2 + 1] - pdVar4[iVar2 * 2 + 1]) +
                    (pdVar4[(long)iVar1 * 2] - pdVar4[(long)iVar2 * 2]) *
                    (pdVar4[(long)iVar1 * 2] - pdVar4[(long)iVar2 * 2]));
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                  *)local_40);
    auVar7._8_8_ = local_40._8_8_ & 0xffffffff;
    auVar7._0_8_ = local_40._0_8_;
  }
  return local_50 / (double)iVar5;
}

Assistant:

double getAveLen(const Mesh& mesh, const Eigen::VectorXd& x) {
    int count = 0;
    double len = 0.0;
    for (auto e: mesh.all_edges()) {
        ++count;
        int st = mesh.to_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
        int end = mesh.from_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
        OpenMesh::Vec2d ev(x[2 * st] - x[2 *end], x[2 * st + 1] - x[2 * end + 1]);
        len += ev.norm();
    }

    return len / count; 
}